

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O1

VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
* createHeader<Fixpp::VersionnedMessage<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>
            (void)

{
  size_type *psVar1;
  byte *pbVar2;
  time_t tVar3;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL>,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  *in_RDI;
  
  memset(in_RDI,0,0x300);
  meta::impl::
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL>,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<115U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<128U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<90U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<91U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<50U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<57U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<143U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<116U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<144U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<129U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<145U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<43U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<97U,_Fixpp::Type::Boolean>_>,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::Field<Fixpp::TagT<212U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<213U,_Fixpp::Type::Data>_>,_Fixpp::Field<Fixpp::TagT<347U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<369U,_Fixpp::Type::Int>_>,_Fixpp::Field<Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
  ::tuple_base(in_RDI);
  in_RDI[1].super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
  value.val_._M_dataplus._M_p = (pointer)0x0;
  in_RDI[1].super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
  value.val_._M_string_length = 0;
  in_RDI[1].super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
  value.val_.field_2._M_allocated_capacity =
       (size_type)
       &in_RDI[1].
        super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_false>;
  *(tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_false> **)
   ((long)&in_RDI[1].
           super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.value
           .val_.field_2 + 8) =
       &in_RDI[1].
        super_tuple_value<1UL,_Fixpp::Field<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_false>;
  *(size_type **)
   &in_RDI[1].super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
    value.empty_ =
       &in_RDI[1].
        super_tuple_value<8UL,_Fixpp::Field<Fixpp::TagT<142U,_Fixpp::Type::String>_>,_false>.value.
        val_._M_string_length;
  Fixpp::
  set<Fixpp::TagT<49u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,char_const(&)[5]>
            ((VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              *)in_RDI,(char (*) [5])"SNDR");
  Fixpp::
  set<Fixpp::TagT<56u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v44::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>,char_const(&)[5]>
            ((VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
              *)in_RDI,(char (*) [5])"TRGT");
  (in_RDI->super_tuple_value<6UL,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_false>).value.
  val_ = 1;
  (in_RDI->super_tuple_value<6UL,_Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_false>).value.
  empty_ = false;
  psVar1 = &in_RDI[1].
            super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
            value.val_._M_string_length;
  *(byte *)psVar1 = (byte)*psVar1 | 0x40;
  *(byte *)&in_RDI[1].
            super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
            value.val_._M_dataplus._M_p =
       *(byte *)&in_RDI[1].
                 super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>
                 .value.val_._M_dataplus._M_p | 4;
  tVar3 = time((time_t *)0x0);
  (in_RDI->
  super_tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>).value.
  val_.m_time = tVar3;
  (in_RDI->
  super_tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>).value.
  val_.m_msec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload_base<int>)0x0;
  (in_RDI->
  super_tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>).value.
  val_.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload_base<int>)0x0;
  (in_RDI->
  super_tuple_value<17UL,_Fixpp::Field<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_false>).value.
  empty_ = false;
  pbVar2 = (byte *)((long)&in_RDI[1].
                           super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>
                           .value.val_._M_string_length + 2);
  *pbVar2 = *pbVar2 | 2;
  *(byte *)&in_RDI[1].
            super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>.
            value.val_._M_dataplus._M_p =
       *(byte *)&in_RDI[1].
                 super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_false>
                 .value.val_._M_dataplus._M_p | 8;
  return (VersionnedMessage<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *)in_RDI;
}

Assistant:

Header createHeader()
{
    Header header;
    Fixpp::set<Fixpp::Tag::SenderCompID>(header, "SNDR");
    Fixpp::set<Fixpp::Tag::TargetCompID>(header, "TRGT");
    Fixpp::set<Fixpp::Tag::MsgSeqNum>(header, 1);
    Fixpp::set<Fixpp::Tag::SendingTime>(header, std::time(nullptr));

    return header;
}